

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::clara::detail::Help::~Help(Help *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__Opt_00190720;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_Opt).m_optNames);
  (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.
  super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase =
       (_func_int **)&PTR__ParserRefImpl_00190810;
  pcVar2 = (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.m_description.
           _M_dataplus._M_p;
  paVar1 = &(this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.m_description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint._M_dataplus._M_p;
  paVar1 = &(this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.m_hint.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  this_00 = (this->super_Opt).super_ParserRefImpl<Catch::clara::detail::Opt>.m_ref.
            super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  operator_delete(this,0x78);
  return;
}

Assistant:

Help( bool &showHelpFlag )
        :   Opt([&]( bool flag ) {
                showHelpFlag = flag;
                return ParserResult::ok( ParseResultType::ShortCircuitAll );
            })
        {
            static_cast<Opt &>( *this )
                    ("display usage information")
                    ["-?"]["-h"]["--help"]
                    .optional();
        }